

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O0

int Cudd_SupportSize(DdManager *dd,DdNode *f)

{
  int *support_00;
  int local_38;
  int local_34;
  int count;
  int size;
  int i;
  int *support;
  DdNode *f_local;
  DdManager *dd_local;
  
  if (dd->size < dd->sizeZ) {
    local_38 = dd->sizeZ;
  }
  else {
    local_38 = dd->size;
  }
  support_00 = (int *)malloc((long)local_38 << 2);
  if (support_00 == (int *)0x0) {
    dd->errorCode = CUDD_MEMORY_OUT;
    dd_local._4_4_ = -1;
  }
  else {
    for (count = 0; count < local_38; count = count + 1) {
      support_00[count] = 0;
    }
    ddSupportStep((DdNode *)((ulong)f & 0xfffffffffffffffe),support_00);
    ddClearFlag((DdNode *)((ulong)f & 0xfffffffffffffffe));
    local_34 = 0;
    for (count = 0; count < local_38; count = count + 1) {
      if (support_00[count] == 1) {
        local_34 = local_34 + 1;
      }
    }
    if (support_00 != (int *)0x0) {
      free(support_00);
    }
    dd_local._4_4_ = local_34;
  }
  return dd_local._4_4_;
}

Assistant:

int
Cudd_SupportSize(
  DdManager * dd /* manager */,
  DdNode * f /* DD whose support size is sought */)
{
    int *support;
    int i;
    int size;
    int count;

    /* Allocate and initialize support array for ddSupportStep. */
    size = ddMax(dd->size, dd->sizeZ);
    support = ABC_ALLOC(int,size);
    if (support == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(CUDD_OUT_OF_MEM);
    }
    for (i = 0; i < size; i++) {
        support[i] = 0;
    }

    /* Compute support and clean up markers. */
    ddSupportStep(Cudd_Regular(f),support);
    ddClearFlag(Cudd_Regular(f));

    /* Count support variables. */
    count = 0;
    for (i = 0; i < size; i++) {
        if (support[i] == 1) count++;
    }

    ABC_FREE(support);
    return(count);

}